

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O3

void asio::detail::
     reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:90:23),_asio::detail::is_continuation_if_running>_>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _func_void_impl_base_ptr_bool *p_Var6;
  undefined8 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long *in_FS_OFFSET;
  function_view fVar8;
  handler_work<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>_>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>,_void>
  w;
  allocator_t<std::allocator<void>_> local_172;
  allocator<void> local_171;
  function local_170;
  scheduler_operation *local_168;
  func_type p_Stack_160;
  _func_void_impl_base_ptr_bool *local_158;
  int local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  strand_service *local_138;
  implementation_type psStack_130;
  ptr local_120;
  type local_108;
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  local_d8;
  ptr local_a8;
  undefined1 local_90 [80];
  undefined8 uStack_40;
  _func_void_impl_base_ptr_bool *local_38;
  
  local_120.v = (reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>_>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)base;
  local_120.p = (reactive_socket_send_op<asio::const_buffers_1,_asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>_>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 *)base;
  execution::detail::any_executor_base::any_executor_base
            (&local_d8.super_any_executor_base,(any_executor_base *)&base[6].task_result_);
  local_d8.prop_fns_ =
       (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)base[8].func_;
  base[8].func_ =
       (func_type)
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_90._0_8_ = *(undefined8 *)&base[3].task_result_;
  local_120.h = (write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>_>
                 *)local_90;
  local_90._8_8_ = base[4].next_;
  local_90._16_8_ = base[4].func_;
  local_90._24_8_ = *(undefined8 *)&base[4].task_result_;
  local_90._32_4_ = *(undefined4 *)&base[5].next_;
  local_90._40_8_ = base[5].func_;
  local_90._48_8_ = *(undefined8 *)&base[5].task_result_;
  local_90._56_8_ = base[6].next_;
  local_90._64_8_ = base[6].func_;
  base[6].func_ = (func_type)0x0;
  base[6].next_ = (scheduler_operation *)0x0;
  local_90._72_8_ = base[1].next_;
  uStack_40 = (error_category *)base[1].func_;
  local_38 = *(_func_void_impl_base_ptr_bool **)&base[1].task_result_;
  ptr::reset(&local_120);
  if (owner != (void *)0x0) {
    if (local_d8.super_any_executor_base.target_ == (void *)0x0) {
      asio_handler_invoke_helpers::
      invoke<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::detail::wrapped_handler<asio::io_context::strand,fineftp::FtpSession::startSendingMessages()::__0,asio::detail::is_continuation_if_running>>,std::error_code,unsigned_long>,asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::detail::wrapped_handler<asio::io_context::strand,fineftp::FtpSession::startSendingMessages()::__0,asio::detail::is_continuation_if_running>>>
                ((binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>_>,_std::error_code,_unsigned_long>
                  *)local_90,
                 (write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>_>
                  *)local_90);
    }
    else {
      asio_prefer_fn::impl::operator()
                (&local_108,(impl *)&asio_prefer_fn::static_instance<asio_prefer_fn::impl>::instance
                 ,&local_d8,(possibly_t<0> *)&execution::detail::blocking_t<0>::possibly,&local_172)
      ;
      p_Var6 = local_38;
      uVar5 = local_90._64_8_;
      uVar4 = local_90._56_8_;
      uVar3 = local_90._32_4_;
      uVar2 = local_90._0_8_;
      if ((local_108.super_any_executor_base.target_fns_)->blocking_execute ==
          (_func_void_any_executor_base_ptr_function_view *)0x0) {
        p_Var1 = (local_108.super_any_executor_base.target_fns_)->execute;
        local_168 = (scheduler_operation *)local_90._8_8_;
        p_Stack_160 = (func_type)local_90._16_8_;
        local_158 = (_func_void_impl_base_ptr_bool *)local_90._24_8_;
        local_138 = (strand_service *)local_90._40_8_;
        psStack_130 = (implementation_type)local_90._48_8_;
        local_90._56_8_ = (element_type *)0x0;
        local_90._64_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_148 = local_90._72_4_;
        uStack_144 = local_90._76_4_;
        uStack_140 = (undefined4)uStack_40;
        uStack_13c = uStack_40._4_4_;
        local_a8.a = &local_171;
        if (*(long *)(*in_FS_OFFSET + -0x10) == 0) {
          uVar7 = 0;
        }
        else {
          uVar7 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x10) + 8);
        }
        local_170.impl_ =
             (impl_base *)
             thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                       (uVar7,0x70);
        local_a8.p = (impl<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
                      *)0x0;
        local_170.impl_[1].complete_ = (_func_void_impl_base_ptr_bool *)uVar2;
        local_170.impl_[2].complete_ = (_func_void_impl_base_ptr_bool *)local_168;
        local_170.impl_[3].complete_ = (_func_void_impl_base_ptr_bool *)p_Stack_160;
        local_170.impl_[4].complete_ = local_158;
        *(undefined4 *)&local_170.impl_[5].complete_ = uVar3;
        local_170.impl_[6].complete_ = (_func_void_impl_base_ptr_bool *)local_138;
        local_170.impl_[7].complete_ = (_func_void_impl_base_ptr_bool *)psStack_130;
        local_170.impl_[8].complete_ = (_func_void_impl_base_ptr_bool *)uVar4;
        local_170.impl_[9].complete_ = (_func_void_impl_base_ptr_bool *)uVar5;
        local_170.impl_[10].complete_ =
             (_func_void_impl_base_ptr_bool *)CONCAT44(uStack_144,local_148);
        local_170.impl_[0xb].complete_ =
             (_func_void_impl_base_ptr_bool *)CONCAT44(uStack_13c,uStack_140);
        local_170.impl_[0xc].complete_ = p_Var6;
        (local_170.impl_)->complete_ =
             executor_function::
             complete<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::detail::wrapped_handler<asio::io_context::strand,fineftp::FtpSession::startSendingMessages()::__0,asio::detail::is_continuation_if_running>>,std::error_code,unsigned_long>,std::allocator<void>>
        ;
        local_a8.v = (void *)0x0;
        executor_function::
        impl<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_asio::detail::wrapped_handler<asio::io_context::strand,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:90:23),_asio::detail::is_continuation_if_running>_>,_std::error_code,_unsigned_long>,_std::allocator<void>_>
        ::ptr::reset(&local_a8);
        (*p_Var1)(&local_108.super_any_executor_base,&local_170);
        if (local_170.impl_ != (impl_base *)0x0) {
          (*(local_170.impl_)->complete_)(local_170.impl_,false);
        }
      }
      else {
        fVar8.function_ = local_90;
        fVar8.complete_ =
             executor_function_view::
             complete<asio::detail::binder2<asio::detail::write_op<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,asio::detail::wrapped_handler<asio::io_context::strand,fineftp::FtpSession::startSendingMessages()::__0,asio::detail::is_continuation_if_running>>,std::error_code,unsigned_long>>
        ;
        (*(local_108.super_any_executor_base.target_fns_)->blocking_execute)
                  (&local_108.super_any_executor_base,fVar8);
      }
      (*(local_108.super_any_executor_base.object_fns_)->destroy)
                (&local_108.super_any_executor_base);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._64_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._64_8_);
  }
  (*(local_d8.super_any_executor_base.object_fns_)->destroy)(&local_d8.super_any_executor_base);
  ptr::reset(&local_120);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_send_op* o(static_cast<reactive_socket_send_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          o->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }